

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3833.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementShellANCF_3833::ComputeMassMatrixAndGravityForce
          (ChElementShellANCF_3833 *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double *pdVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar5;
  undefined1 (*pauVar6) [64];
  long lVar7;
  uint uVar8;
  Index j;
  long lVar9;
  ulong uVar10;
  pointer pLVar11;
  ulong uVar12;
  long lVar13;
  uint it_zeta;
  ulong uVar14;
  bool bVar15;
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  SrcEvaluatorType srcEvaluator;
  DstEvaluatorType dstEvaluator;
  VectorN Sxi_compact;
  type tmp;
  ChMatrixNM<double,_NSF,_NSF>_conflict2 MassMatrixCompactSquare;
  add_assign_op<double,_double> local_2689;
  ulong local_2688;
  ulong local_2680;
  double *local_2678;
  double local_2670;
  double local_2668;
  plainobjectbase_evaluator_data<double,_24> local_2660;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_24,_24,_0,_24,_24>_>,_Eigen::internal::add_assign_op<double,_double>,_0>
  *local_2658;
  double local_2650;
  double local_2648;
  double local_2640;
  double local_2638;
  double local_2630;
  double local_2628;
  double local_2620;
  plainobjectbase_evaluator_data<double,_24> local_2618;
  double local_2610;
  VectorN *local_2608;
  undefined1 local_2600 [128];
  undefined1 local_2580 [64];
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_24,_24,_0,_24,_24>_>,_Eigen::internal::add_assign_op<double,_double>,_0>
  local_2540 [6];
  double local_2480;
  VectorN *pVStack_2478;
  undefined1 local_2400 [4480];
  DstXprType local_1280;
  
  local_2678 = (double *)&local_1280;
  memset(local_2678,0,0x1200);
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.
  m_data.array[0] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.
  m_data.array[1] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.
  m_data.array[2] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.
  m_data.array[3] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.
  m_data.array[4] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.
  m_data.array[5] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.
  m_data.array[6] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.
  m_data.array[7] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.
  m_data.array[8] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.
  m_data.array[9] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.
  m_data.array[10] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.
  m_data.array[0xb] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.
  m_data.array[0xc] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.
  m_data.array[0xd] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.
  m_data.array[0xe] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.
  m_data.array[0xf] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.
  m_data.array[0x10] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.
  m_data.array[0x11] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.
  m_data.array[0x12] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.
  m_data.array[0x13] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.
  m_data.array[0x14] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.
  m_data.array[0x15] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.
  m_data.array[0x16] = 0.0;
  (this->m_GravForceScale).super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.
  m_data.array[0x17] = 0.0;
  if (this->m_numLayers != 0) {
    uVar10 = 0;
    do {
      pLVar11 = (this->m_layers).
                super__Vector_base<chrono::fea::ChElementShellANCF_3833::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3833::Layer>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pdVar4 = &(pLVar11[uVar10].m_material.
                 super___shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->m_rho;
      this_00 = pLVar11[uVar10].m_material.
                super___shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      local_2680 = uVar10;
      if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        local_2670 = *pdVar4;
      }
      else {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
        local_2670 = *pdVar4;
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        pLVar11 = (this->m_layers).
                  super__Vector_base<chrono::fea::ChElementShellANCF_3833::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3833::Layer>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      }
      lVar7 = *(long *)(DAT_00b6abd0 + 0x60);
      lVar9 = *(long *)(DAT_00b6abd0 + 0x68);
      if (lVar9 != lVar7) {
        local_2668 = pLVar11[uVar10].m_thickness;
        local_2688 = 0;
        local_2648 = (this->m_layer_zoffsets).
                     super__Vector_base<double,_Eigen::aligned_allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[local_2680];
        local_2650 = local_2668 * 0.5 + (local_2648 - this->m_thicknessZ * 0.5) +
                     this->m_midsurfoffset;
        do {
          bVar15 = lVar9 != lVar7;
          lVar9 = lVar7;
          if (bVar15) {
            uVar10 = 0;
            do {
              uVar14 = 0;
              do {
                local_2640 = *(double *)(lVar7 + uVar10 * 8);
                local_2630 = *(double *)(lVar7 + uVar14 * 8);
                lVar9 = *(long *)(static_tables_3833 + 0x60);
                local_2620 = *(double *)(lVar9 + local_2688 * 8) * *(double *)(lVar9 + uVar10 * 8) *
                             *(double *)(lVar9 + uVar14 * 8) * local_2670;
                local_2638 = *(double *)(lVar7 + local_2688 * 8);
                local_2628 = Calc_det_J_0xi(this,local_2638,local_2640,local_2630,local_2668,
                                            local_2648);
                Calc_Sxi_compact(this,(VectorN *)local_2600,local_2638,local_2640,local_2630,
                                 local_2668,local_2650);
                pauVar6 = (undefined1 (*) [64])local_2400;
                lVar9 = 0;
                local_2610 = local_2628 * local_2620;
                auVar1._8_8_ = 0;
                auVar1._0_8_ = local_2610;
                auVar16 = vbroadcastsd_avx512f(auVar1);
                auVar17 = vmulpd_avx512f(auVar16,local_2600._0_64_);
                auVar17 = vaddpd_avx512f(auVar17,*(undefined1 (*) [64])
                                                  (this->m_GravForceScale).
                                                  super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>
                                                  .m_storage.m_data.array);
                *(undefined1 (*) [64])
                 (this->m_GravForceScale).
                 super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.m_data.
                 array = auVar17;
                auVar17 = vmulpd_avx512f(auVar16,local_2600._64_64_);
                auVar17 = vaddpd_avx512f(auVar17,*(undefined1 (*) [64])
                                                  ((this->m_GravForceScale).
                                                                                                      
                                                  super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>
                                                  .m_storage.m_data.array + 8));
                *(undefined1 (*) [64])
                 ((this->m_GravForceScale).
                  super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.m_data.
                  array + 8) = auVar17;
                auVar16 = vmulpd_avx512f(auVar16,local_2580);
                auVar16 = vaddpd_avx512f(auVar16,*(undefined1 (*) [64])
                                                  ((this->m_GravForceScale).
                                                                                                      
                                                  super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>
                                                  .m_storage.m_data.array + 0x10));
                *(undefined1 (*) [64])
                 ((this->m_GravForceScale).
                  super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>.m_storage.m_data.
                  array + 0x10) = auVar16;
                auVar2._8_8_ = 0;
                auVar2._0_8_ = local_2610;
                auVar16 = vbroadcastsd_avx512f(auVar2);
                auVar17 = vmulpd_avx512f(auVar16,local_2600._0_64_);
                auVar18 = vmulpd_avx512f(auVar16,local_2600._64_64_);
                auVar16 = vmulpd_avx512f(auVar16,local_2580);
                local_2480 = local_2610;
                pVStack_2478 = (VectorN *)local_2600;
                do {
                  lVar7 = lVar9 * 8;
                  lVar9 = lVar9 + 1;
                  auVar3._8_8_ = 0;
                  auVar3._0_8_ = *(ulong *)(local_2600 + lVar7);
                  auVar19 = vbroadcastsd_avx512f(auVar3);
                  auVar20 = vmulpd_avx512f(auVar17,auVar19);
                  auVar21 = vmulpd_avx512f(auVar18,auVar19);
                  auVar19 = vmulpd_avx512f(auVar16,auVar19);
                  pauVar6[-2] = auVar20;
                  pauVar6[-1] = auVar21;
                  *pauVar6 = auVar19;
                  pauVar6 = pauVar6 + 3;
                } while (lVar9 != 0x18);
                local_2660.data = &local_2480;
                local_2540[0].m_dst = (DstEvaluatorType *)&local_2618;
                local_2540[0].m_src = (SrcEvaluatorType *)&local_2660;
                local_2540[0].m_functor = &local_2689;
                local_2618.data = (double *)&local_1280;
                local_2658 = local_2540;
                local_2608 = (VectorN *)local_2600;
                local_2540[0].m_dstExpr = (DstXprType *)local_2618.data;
                Eigen::internal::
                dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_24,_24,_0,_24,_24>_>,_Eigen::internal::add_assign_op<double,_double>,_0>,_0,_1>
                ::run(local_2540);
                uVar14 = (ulong)((int)uVar14 + 1);
                lVar7 = *(long *)(DAT_00b6abd0 + 0x60);
                uVar12 = *(long *)(DAT_00b6abd0 + 0x68) - lVar7 >> 3;
              } while (uVar14 < uVar12);
              uVar10 = (ulong)((int)uVar10 + 1);
            } while ((uVar10 < uVar12) && (*(long *)(DAT_00b6abd0 + 0x68) != lVar7));
            lVar7 = *(long *)(DAT_00b6abd0 + 0x60);
            lVar9 = *(long *)(DAT_00b6abd0 + 0x68);
          }
          local_2688 = (ulong)((int)local_2688 + 1);
        } while (local_2688 < (ulong)(lVar9 - lVar7 >> 3));
      }
      uVar10 = local_2680 + 1;
    } while (uVar10 < (ulong)(long)this->m_numLayers);
  }
  iVar5 = 0x18;
  uVar8 = 0;
  lVar9 = 0;
  do {
    uVar10 = (ulong)uVar8;
    lVar7 = 300 - uVar10;
    if (300 < uVar10) {
      lVar7 = 0;
    }
    lVar13 = 0;
    do {
      if (lVar7 == lVar13) {
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, 300, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, 300, 1>, Level = 1]"
                     );
      }
      (this->m_MassMatrix).super_PlainObjectBase<Eigen::Matrix<double,_300,_1,_0,_300,_1>_>.
      m_storage.m_data.array[uVar10 + lVar13] = local_2678[lVar13];
      lVar13 = lVar13 + 1;
    } while ((int)lVar13 + (int)lVar9 != 0x18);
    local_2678 = local_2678 + 0x19;
    uVar8 = uVar8 + iVar5;
    lVar9 = lVar9 + 1;
    iVar5 = iVar5 + -1;
  } while (lVar9 != 0x18);
  return;
}

Assistant:

void ChElementShellANCF_3833::ComputeMassMatrixAndGravityForce() {
    // For this element, the mass matrix integrand is of order 9 in xi, 9 in eta, and 9 in zeta.
    // 5 GQ Points are needed in the xi, eta, and zeta directions for exact integration of the element's mass matrix,
    // even if the reference configuration is not straight. Since the major pieces of the generalized force due to
    // gravity can also be used to calculate the mass matrix, these calculations are performed at the same time.  Only
    // the matrix that scales the acceleration due to gravity is calculated at this time so that any changes to the
    // acceleration due to gravity in the system are correctly accounted for in the generalized internal force
    // calculation.

    ChQuadratureTables* GQTable = GetStaticGQTables();
    unsigned int GQ_idx_xi_eta = 4;  // 5 Point Gauss-Quadrature;
    unsigned int GQ_idx_zeta = 4;    // 5 Point Gauss-Quadrature;

    // Mass Matrix in its compact matrix form.  Since the mass matrix is symmetric, just the upper diagonal entries will
    // be stored.
    ChMatrixNM<double, NSF, NSF> MassMatrixCompactSquare;

    // Set these to zeros since they will be incremented as the vector/matrix is calculated
    MassMatrixCompactSquare.setZero();
    m_GravForceScale.setZero();

    for (size_t kl = 0; kl < m_numLayers; kl++) {
        double rho = m_layers[kl].GetMaterial()->Get_rho();  // Density of the material for the current layer
        double thickness = m_layers[kl].Get_thickness();
        double zoffset = m_layer_zoffsets[kl];
        double layer_midsurface_offset =
            -m_thicknessZ / 2 + m_layer_zoffsets[kl] + m_layers[kl].Get_thickness() / 2 + m_midsurfoffset;

        // Sum the contribution to the mass matrix and generalized force due to gravity at the current point
        for (unsigned int it_xi = 0; it_xi < GQTable->Lroots[GQ_idx_xi_eta].size(); it_xi++) {
            for (unsigned int it_eta = 0; it_eta < GQTable->Lroots[GQ_idx_xi_eta].size(); it_eta++) {
                for (unsigned int it_zeta = 0; it_zeta < GQTable->Lroots[GQ_idx_zeta].size(); it_zeta++) {
                    double GQ_weight = GQTable->Weight[GQ_idx_xi_eta][it_xi] * GQTable->Weight[GQ_idx_xi_eta][it_eta] *
                                       GQTable->Weight[GQ_idx_zeta][it_zeta];
                    double xi = GQTable->Lroots[GQ_idx_xi_eta][it_xi];
                    double eta = GQTable->Lroots[GQ_idx_xi_eta][it_eta];
                    double zeta = GQTable->Lroots[GQ_idx_zeta][it_zeta];
                    double det_J_0xi = Calc_det_J_0xi(xi, eta, zeta, thickness,
                                                      zoffset);  // determinant of the element Jacobian (volume ratio)

                    VectorN Sxi_compact;  // Vector of the Unique Normalized Shape Functions
                    Calc_Sxi_compact(Sxi_compact, xi, eta, zeta, thickness, layer_midsurface_offset);

                    m_GravForceScale += (GQ_weight * rho * det_J_0xi) * Sxi_compact;
                    MassMatrixCompactSquare += (GQ_weight * rho * det_J_0xi) * Sxi_compact * Sxi_compact.transpose();
                }
            }
        }
    }

    // Store just the unique entries in the Mass Matrix in Compact Upper Triangular Form
    // since the full Mass Matrix is both sparse and symmetric
    unsigned int idx = 0;
    for (unsigned int i = 0; i < NSF; i++) {
        for (unsigned int j = i; j < NSF; j++) {
            m_MassMatrix(idx) = MassMatrixCompactSquare(i, j);
            idx++;
        }
    }
}